

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-test.c++
# Opt level: O1

void __thiscall kj::anon_unknown_0::TestCase48::run(TestCase48 *this)

{
  char *pcVar1;
  size_t sVar2;
  int iVar3;
  bool bVar4;
  StringPtr name;
  StringPtr name_00;
  StringPtr name_01;
  StringPtr name_02;
  StringPtr name_03;
  StringPtr name_04;
  StringPtr name_05;
  StringPtr name_06;
  StringPtr name_07;
  StringPtr name_08;
  StringPtr name_09;
  StringPtr name_10;
  StringPtr name_11;
  StringPtr name_12;
  StringPtr name_13;
  StringPtr name_14;
  StringPtr name_15;
  StringPtr name_16;
  StringPtr name_17;
  StringPtr name_18;
  StringPtr name_19;
  StringPtr name_20;
  StringPtr name_21;
  StringPtr name_22;
  StringPtr name_23;
  StringPtr name_24;
  StringPtr name_25;
  StringPtr name_26;
  StringPtr name_27;
  StringPtr name_28;
  StringPtr name_29;
  StringPtr name_30;
  String local_38;
  HttpMethod local_1c;
  
  local_1c = GET;
  str<kj::HttpMethod>(&local_38,&local_1c);
  sVar2 = local_38.content.size_;
  bVar4 = true;
  if (local_38.content.size_ == 4) {
    iVar3 = bcmp(local_38.content.ptr,"GET",3);
    bVar4 = iVar3 != 0;
  }
  pcVar1 = local_38.content.ptr;
  if (local_38.content.ptr != (char *)0x0) {
    local_38.content.ptr = (char *)0x0;
    local_38.content.size_ = 0;
    (**(local_38.content.disposer)->_vptr_ArrayDisposer)
              (local_38.content.disposer,pcVar1,1,sVar2,sVar2,0);
  }
  if ((bool)(bVar4 & _::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[51]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x39,ERROR,"\"failed: expected \" \"kj::str(HttpMethod::GET) == \\\"GET\\\"\"",
               (char (*) [51])"failed: expected kj::str(HttpMethod::GET) == \"GET\"");
  }
  name.content.size_ = 4;
  name.content.ptr = "GET";
  tryParseHttpMethod((kj *)&local_38,name);
  if (local_38.content.ptr._0_1_ == (kj)0x1) {
    if ((local_38.content.ptr._4_4_ != 0) && (_::Debug::minSeverity < 3)) {
      _::Debug::log<char_const(&)[44]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x39,ERROR,"\"failed: expected \" \"*parsed == HttpMethod::GET\"",
                 (char (*) [44])"failed: expected *parsed == HttpMethod::GET");
    }
  }
  else if (_::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[35]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x39,ERROR,"\"couldn\'t parse \\\"\" \"GET\" \"\\\" as HttpMethod\"",
               (char (*) [35])"couldn\'t parse \"GET\" as HttpMethod");
  }
  local_1c = HEAD;
  str<kj::HttpMethod>(&local_38,&local_1c);
  sVar2 = local_38.content.size_;
  bVar4 = true;
  if (local_38.content.size_ == 5) {
    iVar3 = bcmp(local_38.content.ptr,"HEAD",4);
    bVar4 = iVar3 != 0;
  }
  pcVar1 = local_38.content.ptr;
  if (local_38.content.ptr != (char *)0x0) {
    local_38.content.ptr = (char *)0x0;
    local_38.content.size_ = 0;
    (**(local_38.content.disposer)->_vptr_ArrayDisposer)
              (local_38.content.disposer,pcVar1,1,sVar2,sVar2,0);
  }
  if ((bool)(bVar4 & _::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[53]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x39,ERROR,"\"failed: expected \" \"kj::str(HttpMethod::HEAD) == \\\"HEAD\\\"\"",
               (char (*) [53])"failed: expected kj::str(HttpMethod::HEAD) == \"HEAD\"");
  }
  name_00.content.size_ = 5;
  name_00.content.ptr = "HEAD";
  tryParseHttpMethod((kj *)&local_38,name_00);
  if (local_38.content.ptr._0_1_ == (kj)0x1) {
    if ((local_38.content.ptr._4_4_ != 1) && (_::Debug::minSeverity < 3)) {
      _::Debug::log<char_const(&)[45]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x39,ERROR,"\"failed: expected \" \"*parsed == HttpMethod::HEAD\"",
                 (char (*) [45])"failed: expected *parsed == HttpMethod::HEAD");
    }
  }
  else if (_::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[36]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x39,ERROR,"\"couldn\'t parse \\\"\" \"HEAD\" \"\\\" as HttpMethod\"",
               (char (*) [36])"couldn\'t parse \"HEAD\" as HttpMethod");
  }
  local_1c = POST;
  str<kj::HttpMethod>(&local_38,&local_1c);
  sVar2 = local_38.content.size_;
  bVar4 = true;
  if (local_38.content.size_ == 5) {
    iVar3 = bcmp(local_38.content.ptr,"POST",4);
    bVar4 = iVar3 != 0;
  }
  pcVar1 = local_38.content.ptr;
  if (local_38.content.ptr != (char *)0x0) {
    local_38.content.ptr = (char *)0x0;
    local_38.content.size_ = 0;
    (**(local_38.content.disposer)->_vptr_ArrayDisposer)
              (local_38.content.disposer,pcVar1,1,sVar2,sVar2,0);
  }
  if ((bool)(bVar4 & _::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[53]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x39,ERROR,"\"failed: expected \" \"kj::str(HttpMethod::POST) == \\\"POST\\\"\"",
               (char (*) [53])"failed: expected kj::str(HttpMethod::POST) == \"POST\"");
  }
  name_01.content.size_ = 5;
  name_01.content.ptr = "POST";
  tryParseHttpMethod((kj *)&local_38,name_01);
  if (local_38.content.ptr._0_1_ == (kj)0x1) {
    if ((local_38.content.ptr._4_4_ != 2) && (_::Debug::minSeverity < 3)) {
      _::Debug::log<char_const(&)[45]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x39,ERROR,"\"failed: expected \" \"*parsed == HttpMethod::POST\"",
                 (char (*) [45])"failed: expected *parsed == HttpMethod::POST");
    }
  }
  else if (_::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[36]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x39,ERROR,"\"couldn\'t parse \\\"\" \"POST\" \"\\\" as HttpMethod\"",
               (char (*) [36])"couldn\'t parse \"POST\" as HttpMethod");
  }
  local_1c = PUT;
  str<kj::HttpMethod>(&local_38,&local_1c);
  sVar2 = local_38.content.size_;
  bVar4 = true;
  if (local_38.content.size_ == 4) {
    iVar3 = bcmp(local_38.content.ptr,"PUT",3);
    bVar4 = iVar3 != 0;
  }
  pcVar1 = local_38.content.ptr;
  if (local_38.content.ptr != (char *)0x0) {
    local_38.content.ptr = (char *)0x0;
    local_38.content.size_ = 0;
    (**(local_38.content.disposer)->_vptr_ArrayDisposer)
              (local_38.content.disposer,pcVar1,1,sVar2,sVar2,0);
  }
  if ((bool)(bVar4 & _::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[51]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x39,ERROR,"\"failed: expected \" \"kj::str(HttpMethod::PUT) == \\\"PUT\\\"\"",
               (char (*) [51])"failed: expected kj::str(HttpMethod::PUT) == \"PUT\"");
  }
  name_02.content.size_ = 4;
  name_02.content.ptr = "PUT";
  tryParseHttpMethod((kj *)&local_38,name_02);
  if (local_38.content.ptr._0_1_ == (kj)0x1) {
    if ((local_38.content.ptr._4_4_ != 3) && (_::Debug::minSeverity < 3)) {
      _::Debug::log<char_const(&)[44]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x39,ERROR,"\"failed: expected \" \"*parsed == HttpMethod::PUT\"",
                 (char (*) [44])"failed: expected *parsed == HttpMethod::PUT");
    }
  }
  else if (_::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[35]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x39,ERROR,"\"couldn\'t parse \\\"\" \"PUT\" \"\\\" as HttpMethod\"",
               (char (*) [35])"couldn\'t parse \"PUT\" as HttpMethod");
  }
  local_1c = DELETE;
  str<kj::HttpMethod>(&local_38,&local_1c);
  sVar2 = local_38.content.size_;
  bVar4 = true;
  if (local_38.content.size_ == 7) {
    iVar3 = bcmp(local_38.content.ptr,"DELETE",6);
    bVar4 = iVar3 != 0;
  }
  pcVar1 = local_38.content.ptr;
  if (local_38.content.ptr != (char *)0x0) {
    local_38.content.ptr = (char *)0x0;
    local_38.content.size_ = 0;
    (**(local_38.content.disposer)->_vptr_ArrayDisposer)
              (local_38.content.disposer,pcVar1,1,sVar2,sVar2,0);
  }
  if ((bool)(bVar4 & _::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[57]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x39,ERROR,"\"failed: expected \" \"kj::str(HttpMethod::DELETE) == \\\"DELETE\\\"\""
               ,(char (*) [57])"failed: expected kj::str(HttpMethod::DELETE) == \"DELETE\"");
  }
  name_03.content.size_ = 7;
  name_03.content.ptr = "DELETE";
  tryParseHttpMethod((kj *)&local_38,name_03);
  if (local_38.content.ptr._0_1_ == (kj)0x1) {
    if ((local_38.content.ptr._4_4_ != 4) && (_::Debug::minSeverity < 3)) {
      _::Debug::log<char_const(&)[47]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x39,ERROR,"\"failed: expected \" \"*parsed == HttpMethod::DELETE\"",
                 (char (*) [47])"failed: expected *parsed == HttpMethod::DELETE");
    }
  }
  else if (_::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[38]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x39,ERROR,"\"couldn\'t parse \\\"\" \"DELETE\" \"\\\" as HttpMethod\"",
               (char (*) [38])"couldn\'t parse \"DELETE\" as HttpMethod");
  }
  local_1c = PATCH;
  str<kj::HttpMethod>(&local_38,&local_1c);
  sVar2 = local_38.content.size_;
  bVar4 = true;
  if (local_38.content.size_ == 6) {
    iVar3 = bcmp(local_38.content.ptr,"PATCH",5);
    bVar4 = iVar3 != 0;
  }
  pcVar1 = local_38.content.ptr;
  if (local_38.content.ptr != (char *)0x0) {
    local_38.content.ptr = (char *)0x0;
    local_38.content.size_ = 0;
    (**(local_38.content.disposer)->_vptr_ArrayDisposer)
              (local_38.content.disposer,pcVar1,1,sVar2,sVar2,0);
  }
  if ((bool)(bVar4 & _::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[55]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x39,ERROR,"\"failed: expected \" \"kj::str(HttpMethod::PATCH) == \\\"PATCH\\\"\"",
               (char (*) [55])"failed: expected kj::str(HttpMethod::PATCH) == \"PATCH\"");
  }
  name_04.content.size_ = 6;
  name_04.content.ptr = "PATCH";
  tryParseHttpMethod((kj *)&local_38,name_04);
  if (local_38.content.ptr._0_1_ == (kj)0x1) {
    if ((local_38.content.ptr._4_4_ != 5) && (_::Debug::minSeverity < 3)) {
      _::Debug::log<char_const(&)[46]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x39,ERROR,"\"failed: expected \" \"*parsed == HttpMethod::PATCH\"",
                 (char (*) [46])"failed: expected *parsed == HttpMethod::PATCH");
    }
  }
  else if (_::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[37]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x39,ERROR,"\"couldn\'t parse \\\"\" \"PATCH\" \"\\\" as HttpMethod\"",
               (char (*) [37])"couldn\'t parse \"PATCH\" as HttpMethod");
  }
  local_1c = PURGE;
  str<kj::HttpMethod>(&local_38,&local_1c);
  sVar2 = local_38.content.size_;
  bVar4 = true;
  if (local_38.content.size_ == 6) {
    iVar3 = bcmp(local_38.content.ptr,"PURGE",5);
    bVar4 = iVar3 != 0;
  }
  pcVar1 = local_38.content.ptr;
  if (local_38.content.ptr != (char *)0x0) {
    local_38.content.ptr = (char *)0x0;
    local_38.content.size_ = 0;
    (**(local_38.content.disposer)->_vptr_ArrayDisposer)
              (local_38.content.disposer,pcVar1,1,sVar2,sVar2,0);
  }
  if ((bool)(bVar4 & _::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[55]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x39,ERROR,"\"failed: expected \" \"kj::str(HttpMethod::PURGE) == \\\"PURGE\\\"\"",
               (char (*) [55])"failed: expected kj::str(HttpMethod::PURGE) == \"PURGE\"");
  }
  name_05.content.size_ = 6;
  name_05.content.ptr = "PURGE";
  tryParseHttpMethod((kj *)&local_38,name_05);
  if (local_38.content.ptr._0_1_ == (kj)0x1) {
    if ((local_38.content.ptr._4_4_ != 6) && (_::Debug::minSeverity < 3)) {
      _::Debug::log<char_const(&)[46]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x39,ERROR,"\"failed: expected \" \"*parsed == HttpMethod::PURGE\"",
                 (char (*) [46])"failed: expected *parsed == HttpMethod::PURGE");
    }
  }
  else if (_::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[37]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x39,ERROR,"\"couldn\'t parse \\\"\" \"PURGE\" \"\\\" as HttpMethod\"",
               (char (*) [37])"couldn\'t parse \"PURGE\" as HttpMethod");
  }
  local_1c = OPTIONS;
  str<kj::HttpMethod>(&local_38,&local_1c);
  sVar2 = local_38.content.size_;
  bVar4 = true;
  if (local_38.content.size_ == 8) {
    iVar3 = bcmp(local_38.content.ptr,"OPTIONS",7);
    bVar4 = iVar3 != 0;
  }
  pcVar1 = local_38.content.ptr;
  if (local_38.content.ptr != (char *)0x0) {
    local_38.content.ptr = (char *)0x0;
    local_38.content.size_ = 0;
    (**(local_38.content.disposer)->_vptr_ArrayDisposer)
              (local_38.content.disposer,pcVar1,1,sVar2,sVar2,0);
  }
  if ((bool)(bVar4 & _::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[59]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x39,ERROR,
               "\"failed: expected \" \"kj::str(HttpMethod::OPTIONS) == \\\"OPTIONS\\\"\"",
               (char (*) [59])"failed: expected kj::str(HttpMethod::OPTIONS) == \"OPTIONS\"");
  }
  name_06.content.size_ = 8;
  name_06.content.ptr = "OPTIONS";
  tryParseHttpMethod((kj *)&local_38,name_06);
  if (local_38.content.ptr._0_1_ == (kj)0x1) {
    if ((local_38.content.ptr._4_4_ != 7) && (_::Debug::minSeverity < 3)) {
      _::Debug::log<char_const(&)[48]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x39,ERROR,"\"failed: expected \" \"*parsed == HttpMethod::OPTIONS\"",
                 (char (*) [48])"failed: expected *parsed == HttpMethod::OPTIONS");
    }
  }
  else if (_::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[39]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x39,ERROR,"\"couldn\'t parse \\\"\" \"OPTIONS\" \"\\\" as HttpMethod\"",
               (char (*) [39])"couldn\'t parse \"OPTIONS\" as HttpMethod");
  }
  local_1c = TRACE;
  str<kj::HttpMethod>(&local_38,&local_1c);
  sVar2 = local_38.content.size_;
  bVar4 = true;
  if (local_38.content.size_ == 6) {
    iVar3 = bcmp(local_38.content.ptr,"TRACE",5);
    bVar4 = iVar3 != 0;
  }
  pcVar1 = local_38.content.ptr;
  if (local_38.content.ptr != (char *)0x0) {
    local_38.content.ptr = (char *)0x0;
    local_38.content.size_ = 0;
    (**(local_38.content.disposer)->_vptr_ArrayDisposer)
              (local_38.content.disposer,pcVar1,1,sVar2,sVar2,0);
  }
  if ((bool)(bVar4 & _::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[55]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x39,ERROR,"\"failed: expected \" \"kj::str(HttpMethod::TRACE) == \\\"TRACE\\\"\"",
               (char (*) [55])"failed: expected kj::str(HttpMethod::TRACE) == \"TRACE\"");
  }
  name_07.content.size_ = 6;
  name_07.content.ptr = "TRACE";
  tryParseHttpMethod((kj *)&local_38,name_07);
  if (local_38.content.ptr._0_1_ == (kj)0x1) {
    if ((local_38.content.ptr._4_4_ != 8) && (_::Debug::minSeverity < 3)) {
      _::Debug::log<char_const(&)[46]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x39,ERROR,"\"failed: expected \" \"*parsed == HttpMethod::TRACE\"",
                 (char (*) [46])"failed: expected *parsed == HttpMethod::TRACE");
    }
  }
  else if (_::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[37]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x39,ERROR,"\"couldn\'t parse \\\"\" \"TRACE\" \"\\\" as HttpMethod\"",
               (char (*) [37])"couldn\'t parse \"TRACE\" as HttpMethod");
  }
  local_1c = COPY;
  str<kj::HttpMethod>(&local_38,&local_1c);
  sVar2 = local_38.content.size_;
  bVar4 = true;
  if (local_38.content.size_ == 5) {
    iVar3 = bcmp(local_38.content.ptr,"COPY",4);
    bVar4 = iVar3 != 0;
  }
  pcVar1 = local_38.content.ptr;
  if (local_38.content.ptr != (char *)0x0) {
    local_38.content.ptr = (char *)0x0;
    local_38.content.size_ = 0;
    (**(local_38.content.disposer)->_vptr_ArrayDisposer)
              (local_38.content.disposer,pcVar1,1,sVar2,sVar2,0);
  }
  if ((bool)(bVar4 & _::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[53]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x39,ERROR,"\"failed: expected \" \"kj::str(HttpMethod::COPY) == \\\"COPY\\\"\"",
               (char (*) [53])"failed: expected kj::str(HttpMethod::COPY) == \"COPY\"");
  }
  name_08.content.size_ = 5;
  name_08.content.ptr = "COPY";
  tryParseHttpMethod((kj *)&local_38,name_08);
  if (local_38.content.ptr._0_1_ == (kj)0x1) {
    if ((local_38.content.ptr._4_4_ != 9) && (_::Debug::minSeverity < 3)) {
      _::Debug::log<char_const(&)[45]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x39,ERROR,"\"failed: expected \" \"*parsed == HttpMethod::COPY\"",
                 (char (*) [45])"failed: expected *parsed == HttpMethod::COPY");
    }
  }
  else if (_::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[36]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x39,ERROR,"\"couldn\'t parse \\\"\" \"COPY\" \"\\\" as HttpMethod\"",
               (char (*) [36])"couldn\'t parse \"COPY\" as HttpMethod");
  }
  local_1c = LOCK;
  str<kj::HttpMethod>(&local_38,&local_1c);
  sVar2 = local_38.content.size_;
  bVar4 = true;
  if (local_38.content.size_ == 5) {
    iVar3 = bcmp(local_38.content.ptr,"LOCK",4);
    bVar4 = iVar3 != 0;
  }
  pcVar1 = local_38.content.ptr;
  if (local_38.content.ptr != (char *)0x0) {
    local_38.content.ptr = (char *)0x0;
    local_38.content.size_ = 0;
    (**(local_38.content.disposer)->_vptr_ArrayDisposer)
              (local_38.content.disposer,pcVar1,1,sVar2,sVar2,0);
  }
  if ((bool)(bVar4 & _::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[53]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x39,ERROR,"\"failed: expected \" \"kj::str(HttpMethod::LOCK) == \\\"LOCK\\\"\"",
               (char (*) [53])"failed: expected kj::str(HttpMethod::LOCK) == \"LOCK\"");
  }
  name_09.content.size_ = 5;
  name_09.content.ptr = "LOCK";
  tryParseHttpMethod((kj *)&local_38,name_09);
  if (local_38.content.ptr._0_1_ == (kj)0x1) {
    if ((local_38.content.ptr._4_4_ != 10) && (_::Debug::minSeverity < 3)) {
      _::Debug::log<char_const(&)[45]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x39,ERROR,"\"failed: expected \" \"*parsed == HttpMethod::LOCK\"",
                 (char (*) [45])"failed: expected *parsed == HttpMethod::LOCK");
    }
  }
  else if (_::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[36]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x39,ERROR,"\"couldn\'t parse \\\"\" \"LOCK\" \"\\\" as HttpMethod\"",
               (char (*) [36])"couldn\'t parse \"LOCK\" as HttpMethod");
  }
  local_1c = MKCOL;
  str<kj::HttpMethod>(&local_38,&local_1c);
  sVar2 = local_38.content.size_;
  bVar4 = true;
  if (local_38.content.size_ == 6) {
    iVar3 = bcmp(local_38.content.ptr,"MKCOL",5);
    bVar4 = iVar3 != 0;
  }
  pcVar1 = local_38.content.ptr;
  if (local_38.content.ptr != (char *)0x0) {
    local_38.content.ptr = (char *)0x0;
    local_38.content.size_ = 0;
    (**(local_38.content.disposer)->_vptr_ArrayDisposer)
              (local_38.content.disposer,pcVar1,1,sVar2,sVar2,0);
  }
  if ((bool)(bVar4 & _::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[55]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x39,ERROR,"\"failed: expected \" \"kj::str(HttpMethod::MKCOL) == \\\"MKCOL\\\"\"",
               (char (*) [55])"failed: expected kj::str(HttpMethod::MKCOL) == \"MKCOL\"");
  }
  name_10.content.size_ = 6;
  name_10.content.ptr = "MKCOL";
  tryParseHttpMethod((kj *)&local_38,name_10);
  if (local_38.content.ptr._0_1_ == (kj)0x1) {
    if ((local_38.content.ptr._4_4_ != 0xb) && (_::Debug::minSeverity < 3)) {
      _::Debug::log<char_const(&)[46]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x39,ERROR,"\"failed: expected \" \"*parsed == HttpMethod::MKCOL\"",
                 (char (*) [46])"failed: expected *parsed == HttpMethod::MKCOL");
    }
  }
  else if (_::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[37]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x39,ERROR,"\"couldn\'t parse \\\"\" \"MKCOL\" \"\\\" as HttpMethod\"",
               (char (*) [37])"couldn\'t parse \"MKCOL\" as HttpMethod");
  }
  local_1c = MOVE;
  str<kj::HttpMethod>(&local_38,&local_1c);
  sVar2 = local_38.content.size_;
  bVar4 = true;
  if (local_38.content.size_ == 5) {
    iVar3 = bcmp(local_38.content.ptr,"MOVE",4);
    bVar4 = iVar3 != 0;
  }
  pcVar1 = local_38.content.ptr;
  if (local_38.content.ptr != (char *)0x0) {
    local_38.content.ptr = (char *)0x0;
    local_38.content.size_ = 0;
    (**(local_38.content.disposer)->_vptr_ArrayDisposer)
              (local_38.content.disposer,pcVar1,1,sVar2,sVar2,0);
  }
  if ((bool)(bVar4 & _::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[53]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x39,ERROR,"\"failed: expected \" \"kj::str(HttpMethod::MOVE) == \\\"MOVE\\\"\"",
               (char (*) [53])"failed: expected kj::str(HttpMethod::MOVE) == \"MOVE\"");
  }
  name_11.content.size_ = 5;
  name_11.content.ptr = "MOVE";
  tryParseHttpMethod((kj *)&local_38,name_11);
  if (local_38.content.ptr._0_1_ == (kj)0x1) {
    if ((local_38.content.ptr._4_4_ != 0xc) && (_::Debug::minSeverity < 3)) {
      _::Debug::log<char_const(&)[45]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x39,ERROR,"\"failed: expected \" \"*parsed == HttpMethod::MOVE\"",
                 (char (*) [45])"failed: expected *parsed == HttpMethod::MOVE");
    }
  }
  else if (_::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[36]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x39,ERROR,"\"couldn\'t parse \\\"\" \"MOVE\" \"\\\" as HttpMethod\"",
               (char (*) [36])"couldn\'t parse \"MOVE\" as HttpMethod");
  }
  local_1c = PROPFIND;
  str<kj::HttpMethod>(&local_38,&local_1c);
  sVar2 = local_38.content.size_;
  bVar4 = true;
  if (local_38.content.size_ == 9) {
    iVar3 = bcmp(local_38.content.ptr,"PROPFIND",8);
    bVar4 = iVar3 != 0;
  }
  pcVar1 = local_38.content.ptr;
  if (local_38.content.ptr != (char *)0x0) {
    local_38.content.ptr = (char *)0x0;
    local_38.content.size_ = 0;
    (**(local_38.content.disposer)->_vptr_ArrayDisposer)
              (local_38.content.disposer,pcVar1,1,sVar2,sVar2,0);
  }
  if ((bool)(bVar4 & _::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[61]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x39,ERROR,
               "\"failed: expected \" \"kj::str(HttpMethod::PROPFIND) == \\\"PROPFIND\\\"\"",
               (char (*) [61])"failed: expected kj::str(HttpMethod::PROPFIND) == \"PROPFIND\"");
  }
  name_12.content.size_ = 9;
  name_12.content.ptr = "PROPFIND";
  tryParseHttpMethod((kj *)&local_38,name_12);
  if (local_38.content.ptr._0_1_ == (kj)0x1) {
    if ((local_38.content.ptr._4_4_ != 0xd) && (_::Debug::minSeverity < 3)) {
      _::Debug::log<char_const(&)[49]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x39,ERROR,"\"failed: expected \" \"*parsed == HttpMethod::PROPFIND\"",
                 (char (*) [49])"failed: expected *parsed == HttpMethod::PROPFIND");
    }
  }
  else if (_::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[40]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x39,ERROR,"\"couldn\'t parse \\\"\" \"PROPFIND\" \"\\\" as HttpMethod\"",
               (char (*) [40])"couldn\'t parse \"PROPFIND\" as HttpMethod");
  }
  local_1c = PROPPATCH;
  str<kj::HttpMethod>(&local_38,&local_1c);
  sVar2 = local_38.content.size_;
  bVar4 = true;
  if (local_38.content.size_ == 10) {
    iVar3 = bcmp(local_38.content.ptr,"PROPPATCH",9);
    bVar4 = iVar3 != 0;
  }
  pcVar1 = local_38.content.ptr;
  if (local_38.content.ptr != (char *)0x0) {
    local_38.content.ptr = (char *)0x0;
    local_38.content.size_ = 0;
    (**(local_38.content.disposer)->_vptr_ArrayDisposer)
              (local_38.content.disposer,pcVar1,1,sVar2,sVar2,0);
  }
  if ((bool)(bVar4 & _::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[63]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x39,ERROR,
               "\"failed: expected \" \"kj::str(HttpMethod::PROPPATCH) == \\\"PROPPATCH\\\"\"",
               (char (*) [63])"failed: expected kj::str(HttpMethod::PROPPATCH) == \"PROPPATCH\"");
  }
  name_13.content.size_ = 10;
  name_13.content.ptr = "PROPPATCH";
  tryParseHttpMethod((kj *)&local_38,name_13);
  if (local_38.content.ptr._0_1_ == (kj)0x1) {
    if ((local_38.content.ptr._4_4_ != 0xe) && (_::Debug::minSeverity < 3)) {
      _::Debug::log<char_const(&)[50]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x39,ERROR,"\"failed: expected \" \"*parsed == HttpMethod::PROPPATCH\"",
                 (char (*) [50])"failed: expected *parsed == HttpMethod::PROPPATCH");
    }
  }
  else if (_::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[41]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x39,ERROR,"\"couldn\'t parse \\\"\" \"PROPPATCH\" \"\\\" as HttpMethod\"",
               (char (*) [41])"couldn\'t parse \"PROPPATCH\" as HttpMethod");
  }
  local_1c = SEARCH;
  str<kj::HttpMethod>(&local_38,&local_1c);
  sVar2 = local_38.content.size_;
  bVar4 = true;
  if (local_38.content.size_ == 7) {
    iVar3 = bcmp(local_38.content.ptr,"SEARCH",6);
    bVar4 = iVar3 != 0;
  }
  pcVar1 = local_38.content.ptr;
  if (local_38.content.ptr != (char *)0x0) {
    local_38.content.ptr = (char *)0x0;
    local_38.content.size_ = 0;
    (**(local_38.content.disposer)->_vptr_ArrayDisposer)
              (local_38.content.disposer,pcVar1,1,sVar2,sVar2,0);
  }
  if ((bool)(bVar4 & _::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[57]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x39,ERROR,"\"failed: expected \" \"kj::str(HttpMethod::SEARCH) == \\\"SEARCH\\\"\""
               ,(char (*) [57])"failed: expected kj::str(HttpMethod::SEARCH) == \"SEARCH\"");
  }
  name_14.content.size_ = 7;
  name_14.content.ptr = "SEARCH";
  tryParseHttpMethod((kj *)&local_38,name_14);
  if (local_38.content.ptr._0_1_ == (kj)0x1) {
    if ((local_38.content.ptr._4_4_ != 0xf) && (_::Debug::minSeverity < 3)) {
      _::Debug::log<char_const(&)[47]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x39,ERROR,"\"failed: expected \" \"*parsed == HttpMethod::SEARCH\"",
                 (char (*) [47])"failed: expected *parsed == HttpMethod::SEARCH");
    }
  }
  else if (_::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[38]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x39,ERROR,"\"couldn\'t parse \\\"\" \"SEARCH\" \"\\\" as HttpMethod\"",
               (char (*) [38])"couldn\'t parse \"SEARCH\" as HttpMethod");
  }
  local_1c = UNLOCK;
  str<kj::HttpMethod>(&local_38,&local_1c);
  sVar2 = local_38.content.size_;
  bVar4 = true;
  if (local_38.content.size_ == 7) {
    iVar3 = bcmp(local_38.content.ptr,"UNLOCK",6);
    bVar4 = iVar3 != 0;
  }
  pcVar1 = local_38.content.ptr;
  if (local_38.content.ptr != (char *)0x0) {
    local_38.content.ptr = (char *)0x0;
    local_38.content.size_ = 0;
    (**(local_38.content.disposer)->_vptr_ArrayDisposer)
              (local_38.content.disposer,pcVar1,1,sVar2,sVar2,0);
  }
  if ((bool)(bVar4 & _::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[57]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x39,ERROR,"\"failed: expected \" \"kj::str(HttpMethod::UNLOCK) == \\\"UNLOCK\\\"\""
               ,(char (*) [57])"failed: expected kj::str(HttpMethod::UNLOCK) == \"UNLOCK\"");
  }
  name_15.content.size_ = 7;
  name_15.content.ptr = "UNLOCK";
  tryParseHttpMethod((kj *)&local_38,name_15);
  if (local_38.content.ptr._0_1_ == (kj)0x1) {
    if ((local_38.content.ptr._4_4_ != 0x10) && (_::Debug::minSeverity < 3)) {
      _::Debug::log<char_const(&)[47]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x39,ERROR,"\"failed: expected \" \"*parsed == HttpMethod::UNLOCK\"",
                 (char (*) [47])"failed: expected *parsed == HttpMethod::UNLOCK");
    }
  }
  else if (_::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[38]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x39,ERROR,"\"couldn\'t parse \\\"\" \"UNLOCK\" \"\\\" as HttpMethod\"",
               (char (*) [38])"couldn\'t parse \"UNLOCK\" as HttpMethod");
  }
  local_1c = ACL;
  str<kj::HttpMethod>(&local_38,&local_1c);
  sVar2 = local_38.content.size_;
  bVar4 = true;
  if (local_38.content.size_ == 4) {
    iVar3 = bcmp(local_38.content.ptr,"ACL",3);
    bVar4 = iVar3 != 0;
  }
  pcVar1 = local_38.content.ptr;
  if (local_38.content.ptr != (char *)0x0) {
    local_38.content.ptr = (char *)0x0;
    local_38.content.size_ = 0;
    (**(local_38.content.disposer)->_vptr_ArrayDisposer)
              (local_38.content.disposer,pcVar1,1,sVar2,sVar2,0);
  }
  if ((bool)(bVar4 & _::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[51]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x39,ERROR,"\"failed: expected \" \"kj::str(HttpMethod::ACL) == \\\"ACL\\\"\"",
               (char (*) [51])"failed: expected kj::str(HttpMethod::ACL) == \"ACL\"");
  }
  name_16.content.size_ = 4;
  name_16.content.ptr = "ACL";
  tryParseHttpMethod((kj *)&local_38,name_16);
  if (local_38.content.ptr._0_1_ == (kj)0x1) {
    if ((local_38.content.ptr._4_4_ != 0x11) && (_::Debug::minSeverity < 3)) {
      _::Debug::log<char_const(&)[44]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x39,ERROR,"\"failed: expected \" \"*parsed == HttpMethod::ACL\"",
                 (char (*) [44])"failed: expected *parsed == HttpMethod::ACL");
    }
  }
  else if (_::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[35]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x39,ERROR,"\"couldn\'t parse \\\"\" \"ACL\" \"\\\" as HttpMethod\"",
               (char (*) [35])"couldn\'t parse \"ACL\" as HttpMethod");
  }
  local_1c = REPORT;
  str<kj::HttpMethod>(&local_38,&local_1c);
  sVar2 = local_38.content.size_;
  bVar4 = true;
  if (local_38.content.size_ == 7) {
    iVar3 = bcmp(local_38.content.ptr,"REPORT",6);
    bVar4 = iVar3 != 0;
  }
  pcVar1 = local_38.content.ptr;
  if (local_38.content.ptr != (char *)0x0) {
    local_38.content.ptr = (char *)0x0;
    local_38.content.size_ = 0;
    (**(local_38.content.disposer)->_vptr_ArrayDisposer)
              (local_38.content.disposer,pcVar1,1,sVar2,sVar2,0);
  }
  if ((bool)(bVar4 & _::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[57]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x39,ERROR,"\"failed: expected \" \"kj::str(HttpMethod::REPORT) == \\\"REPORT\\\"\""
               ,(char (*) [57])"failed: expected kj::str(HttpMethod::REPORT) == \"REPORT\"");
  }
  name_17.content.size_ = 7;
  name_17.content.ptr = "REPORT";
  tryParseHttpMethod((kj *)&local_38,name_17);
  if (local_38.content.ptr._0_1_ == (kj)0x1) {
    if ((local_38.content.ptr._4_4_ != 0x12) && (_::Debug::minSeverity < 3)) {
      _::Debug::log<char_const(&)[47]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x39,ERROR,"\"failed: expected \" \"*parsed == HttpMethod::REPORT\"",
                 (char (*) [47])"failed: expected *parsed == HttpMethod::REPORT");
    }
  }
  else if (_::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[38]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x39,ERROR,"\"couldn\'t parse \\\"\" \"REPORT\" \"\\\" as HttpMethod\"",
               (char (*) [38])"couldn\'t parse \"REPORT\" as HttpMethod");
  }
  local_1c = MKACTIVITY;
  str<kj::HttpMethod>(&local_38,&local_1c);
  sVar2 = local_38.content.size_;
  bVar4 = true;
  if (local_38.content.size_ == 0xb) {
    iVar3 = bcmp(local_38.content.ptr,"MKACTIVITY",10);
    bVar4 = iVar3 != 0;
  }
  pcVar1 = local_38.content.ptr;
  if (local_38.content.ptr != (char *)0x0) {
    local_38.content.ptr = (char *)0x0;
    local_38.content.size_ = 0;
    (**(local_38.content.disposer)->_vptr_ArrayDisposer)
              (local_38.content.disposer,pcVar1,1,sVar2,sVar2,0);
  }
  if ((bool)(bVar4 & _::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[65]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x39,ERROR,
               "\"failed: expected \" \"kj::str(HttpMethod::MKACTIVITY) == \\\"MKACTIVITY\\\"\"",
               (char (*) [65])"failed: expected kj::str(HttpMethod::MKACTIVITY) == \"MKACTIVITY\"");
  }
  name_18.content.size_ = 0xb;
  name_18.content.ptr = "MKACTIVITY";
  tryParseHttpMethod((kj *)&local_38,name_18);
  if (local_38.content.ptr._0_1_ == (kj)0x1) {
    if ((local_38.content.ptr._4_4_ != 0x13) && (_::Debug::minSeverity < 3)) {
      _::Debug::log<char_const(&)[51]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x39,ERROR,"\"failed: expected \" \"*parsed == HttpMethod::MKACTIVITY\"",
                 (char (*) [51])"failed: expected *parsed == HttpMethod::MKACTIVITY");
    }
  }
  else if (_::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[42]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x39,ERROR,"\"couldn\'t parse \\\"\" \"MKACTIVITY\" \"\\\" as HttpMethod\"",
               (char (*) [42])"couldn\'t parse \"MKACTIVITY\" as HttpMethod");
  }
  local_1c = CHECKOUT;
  str<kj::HttpMethod>(&local_38,&local_1c);
  sVar2 = local_38.content.size_;
  bVar4 = true;
  if (local_38.content.size_ == 9) {
    iVar3 = bcmp(local_38.content.ptr,"CHECKOUT",8);
    bVar4 = iVar3 != 0;
  }
  pcVar1 = local_38.content.ptr;
  if (local_38.content.ptr != (char *)0x0) {
    local_38.content.ptr = (char *)0x0;
    local_38.content.size_ = 0;
    (**(local_38.content.disposer)->_vptr_ArrayDisposer)
              (local_38.content.disposer,pcVar1,1,sVar2,sVar2,0);
  }
  if ((bool)(bVar4 & _::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[61]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x39,ERROR,
               "\"failed: expected \" \"kj::str(HttpMethod::CHECKOUT) == \\\"CHECKOUT\\\"\"",
               (char (*) [61])"failed: expected kj::str(HttpMethod::CHECKOUT) == \"CHECKOUT\"");
  }
  name_19.content.size_ = 9;
  name_19.content.ptr = "CHECKOUT";
  tryParseHttpMethod((kj *)&local_38,name_19);
  if (local_38.content.ptr._0_1_ == (kj)0x1) {
    if ((local_38.content.ptr._4_4_ != 0x14) && (_::Debug::minSeverity < 3)) {
      _::Debug::log<char_const(&)[49]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x39,ERROR,"\"failed: expected \" \"*parsed == HttpMethod::CHECKOUT\"",
                 (char (*) [49])"failed: expected *parsed == HttpMethod::CHECKOUT");
    }
  }
  else if (_::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[40]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x39,ERROR,"\"couldn\'t parse \\\"\" \"CHECKOUT\" \"\\\" as HttpMethod\"",
               (char (*) [40])"couldn\'t parse \"CHECKOUT\" as HttpMethod");
  }
  local_1c = MERGE;
  str<kj::HttpMethod>(&local_38,&local_1c);
  sVar2 = local_38.content.size_;
  bVar4 = true;
  if (local_38.content.size_ == 6) {
    iVar3 = bcmp(local_38.content.ptr,"MERGE",5);
    bVar4 = iVar3 != 0;
  }
  pcVar1 = local_38.content.ptr;
  if (local_38.content.ptr != (char *)0x0) {
    local_38.content.ptr = (char *)0x0;
    local_38.content.size_ = 0;
    (**(local_38.content.disposer)->_vptr_ArrayDisposer)
              (local_38.content.disposer,pcVar1,1,sVar2,sVar2,0);
  }
  if ((bool)(bVar4 & _::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[55]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x39,ERROR,"\"failed: expected \" \"kj::str(HttpMethod::MERGE) == \\\"MERGE\\\"\"",
               (char (*) [55])"failed: expected kj::str(HttpMethod::MERGE) == \"MERGE\"");
  }
  name_20.content.size_ = 6;
  name_20.content.ptr = "MERGE";
  tryParseHttpMethod((kj *)&local_38,name_20);
  if (local_38.content.ptr._0_1_ == (kj)0x1) {
    if ((local_38.content.ptr._4_4_ != 0x15) && (_::Debug::minSeverity < 3)) {
      _::Debug::log<char_const(&)[46]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x39,ERROR,"\"failed: expected \" \"*parsed == HttpMethod::MERGE\"",
                 (char (*) [46])"failed: expected *parsed == HttpMethod::MERGE");
    }
  }
  else if (_::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[37]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x39,ERROR,"\"couldn\'t parse \\\"\" \"MERGE\" \"\\\" as HttpMethod\"",
               (char (*) [37])"couldn\'t parse \"MERGE\" as HttpMethod");
  }
  local_1c = MSEARCH;
  str<kj::HttpMethod>(&local_38,&local_1c);
  sVar2 = local_38.content.size_;
  bVar4 = true;
  if (local_38.content.size_ == 8) {
    iVar3 = bcmp(local_38.content.ptr,"MSEARCH",7);
    bVar4 = iVar3 != 0;
  }
  pcVar1 = local_38.content.ptr;
  if (local_38.content.ptr != (char *)0x0) {
    local_38.content.ptr = (char *)0x0;
    local_38.content.size_ = 0;
    (**(local_38.content.disposer)->_vptr_ArrayDisposer)
              (local_38.content.disposer,pcVar1,1,sVar2,sVar2,0);
  }
  if ((bool)(bVar4 & _::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[59]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x39,ERROR,
               "\"failed: expected \" \"kj::str(HttpMethod::MSEARCH) == \\\"MSEARCH\\\"\"",
               (char (*) [59])"failed: expected kj::str(HttpMethod::MSEARCH) == \"MSEARCH\"");
  }
  name_21.content.size_ = 8;
  name_21.content.ptr = "MSEARCH";
  tryParseHttpMethod((kj *)&local_38,name_21);
  if (local_38.content.ptr._0_1_ == (kj)0x1) {
    if ((local_38.content.ptr._4_4_ != 0x16) && (_::Debug::minSeverity < 3)) {
      _::Debug::log<char_const(&)[48]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x39,ERROR,"\"failed: expected \" \"*parsed == HttpMethod::MSEARCH\"",
                 (char (*) [48])"failed: expected *parsed == HttpMethod::MSEARCH");
    }
  }
  else if (_::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[39]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x39,ERROR,"\"couldn\'t parse \\\"\" \"MSEARCH\" \"\\\" as HttpMethod\"",
               (char (*) [39])"couldn\'t parse \"MSEARCH\" as HttpMethod");
  }
  local_1c = NOTIFY;
  str<kj::HttpMethod>(&local_38,&local_1c);
  sVar2 = local_38.content.size_;
  bVar4 = true;
  if (local_38.content.size_ == 7) {
    iVar3 = bcmp(local_38.content.ptr,"NOTIFY",6);
    bVar4 = iVar3 != 0;
  }
  pcVar1 = local_38.content.ptr;
  if (local_38.content.ptr != (char *)0x0) {
    local_38.content.ptr = (char *)0x0;
    local_38.content.size_ = 0;
    (**(local_38.content.disposer)->_vptr_ArrayDisposer)
              (local_38.content.disposer,pcVar1,1,sVar2,sVar2,0);
  }
  if ((bool)(bVar4 & _::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[57]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x39,ERROR,"\"failed: expected \" \"kj::str(HttpMethod::NOTIFY) == \\\"NOTIFY\\\"\""
               ,(char (*) [57])"failed: expected kj::str(HttpMethod::NOTIFY) == \"NOTIFY\"");
  }
  name_22.content.size_ = 7;
  name_22.content.ptr = "NOTIFY";
  tryParseHttpMethod((kj *)&local_38,name_22);
  if (local_38.content.ptr._0_1_ == (kj)0x1) {
    if ((local_38.content.ptr._4_4_ != 0x17) && (_::Debug::minSeverity < 3)) {
      _::Debug::log<char_const(&)[47]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x39,ERROR,"\"failed: expected \" \"*parsed == HttpMethod::NOTIFY\"",
                 (char (*) [47])"failed: expected *parsed == HttpMethod::NOTIFY");
    }
  }
  else if (_::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[38]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x39,ERROR,"\"couldn\'t parse \\\"\" \"NOTIFY\" \"\\\" as HttpMethod\"",
               (char (*) [38])"couldn\'t parse \"NOTIFY\" as HttpMethod");
  }
  local_1c = SUBSCRIBE;
  str<kj::HttpMethod>(&local_38,&local_1c);
  sVar2 = local_38.content.size_;
  bVar4 = true;
  if (local_38.content.size_ == 10) {
    iVar3 = bcmp(local_38.content.ptr,"SUBSCRIBE",9);
    bVar4 = iVar3 != 0;
  }
  pcVar1 = local_38.content.ptr;
  if (local_38.content.ptr != (char *)0x0) {
    local_38.content.ptr = (char *)0x0;
    local_38.content.size_ = 0;
    (**(local_38.content.disposer)->_vptr_ArrayDisposer)
              (local_38.content.disposer,pcVar1,1,sVar2,sVar2,0);
  }
  if ((bool)(bVar4 & _::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[63]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x39,ERROR,
               "\"failed: expected \" \"kj::str(HttpMethod::SUBSCRIBE) == \\\"SUBSCRIBE\\\"\"",
               (char (*) [63])"failed: expected kj::str(HttpMethod::SUBSCRIBE) == \"SUBSCRIBE\"");
  }
  name_23.content.size_ = 10;
  name_23.content.ptr = "SUBSCRIBE";
  tryParseHttpMethod((kj *)&local_38,name_23);
  if (local_38.content.ptr._0_1_ == (kj)0x1) {
    if ((local_38.content.ptr._4_4_ != 0x18) && (_::Debug::minSeverity < 3)) {
      _::Debug::log<char_const(&)[50]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x39,ERROR,"\"failed: expected \" \"*parsed == HttpMethod::SUBSCRIBE\"",
                 (char (*) [50])"failed: expected *parsed == HttpMethod::SUBSCRIBE");
    }
  }
  else if (_::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[41]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x39,ERROR,"\"couldn\'t parse \\\"\" \"SUBSCRIBE\" \"\\\" as HttpMethod\"",
               (char (*) [41])"couldn\'t parse \"SUBSCRIBE\" as HttpMethod");
  }
  local_1c = UNSUBSCRIBE;
  str<kj::HttpMethod>(&local_38,&local_1c);
  sVar2 = local_38.content.size_;
  bVar4 = true;
  if (local_38.content.size_ == 0xc) {
    iVar3 = bcmp(local_38.content.ptr,"UNSUBSCRIBE",0xb);
    bVar4 = iVar3 != 0;
  }
  pcVar1 = local_38.content.ptr;
  if (local_38.content.ptr != (char *)0x0) {
    local_38.content.ptr = (char *)0x0;
    local_38.content.size_ = 0;
    (**(local_38.content.disposer)->_vptr_ArrayDisposer)
              (local_38.content.disposer,pcVar1,1,sVar2,sVar2,0);
  }
  if ((bool)(bVar4 & _::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[67]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x39,ERROR,
               "\"failed: expected \" \"kj::str(HttpMethod::UNSUBSCRIBE) == \\\"UNSUBSCRIBE\\\"\"",
               (char (*) [67])"failed: expected kj::str(HttpMethod::UNSUBSCRIBE) == \"UNSUBSCRIBE\""
              );
  }
  name_24.content.size_ = 0xc;
  name_24.content.ptr = "UNSUBSCRIBE";
  tryParseHttpMethod((kj *)&local_38,name_24);
  if (local_38.content.ptr._0_1_ == (kj)0x1) {
    if ((local_38.content.ptr._4_4_ != 0x19) && (_::Debug::minSeverity < 3)) {
      _::Debug::log<char_const(&)[52]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x39,ERROR,"\"failed: expected \" \"*parsed == HttpMethod::UNSUBSCRIBE\"",
                 (char (*) [52])"failed: expected *parsed == HttpMethod::UNSUBSCRIBE");
    }
  }
  else if (_::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[43]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x39,ERROR,"\"couldn\'t parse \\\"\" \"UNSUBSCRIBE\" \"\\\" as HttpMethod\"",
               (char (*) [43])"couldn\'t parse \"UNSUBSCRIBE\" as HttpMethod");
  }
  name_25.content.size_ = 4;
  name_25.content.ptr = "FOO";
  tryParseHttpMethod((kj *)&local_38,name_25);
  if ((local_38.content.ptr._0_1_ == (kj)0x1) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[54]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x3c,ERROR,"\"failed: expected \" \"tryParseHttpMethod(\\\"FOO\\\") == nullptr\"",
               (char (*) [54])"failed: expected tryParseHttpMethod(\"FOO\") == nullptr");
  }
  name_26.content.size_ = 1;
  name_26.content.ptr = "";
  tryParseHttpMethod((kj *)&local_38,name_26);
  if ((local_38.content.ptr._0_1_ == (kj)0x1) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[51]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x3d,ERROR,"\"failed: expected \" \"tryParseHttpMethod(\\\"\\\") == nullptr\"",
               (char (*) [51])"failed: expected tryParseHttpMethod(\"\") == nullptr");
  }
  name_27.content.size_ = 2;
  name_27.content.ptr = "G";
  tryParseHttpMethod((kj *)&local_38,name_27);
  if ((local_38.content.ptr._0_1_ == (kj)0x1) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[52]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x3e,ERROR,"\"failed: expected \" \"tryParseHttpMethod(\\\"G\\\") == nullptr\"",
               (char (*) [52])"failed: expected tryParseHttpMethod(\"G\") == nullptr");
  }
  name_28.content.size_ = 3;
  name_28.content.ptr = "GE";
  tryParseHttpMethod((kj *)&local_38,name_28);
  if ((local_38.content.ptr._0_1_ == (kj)0x1) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[53]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x3f,ERROR,"\"failed: expected \" \"tryParseHttpMethod(\\\"GE\\\") == nullptr\"",
               (char (*) [53])"failed: expected tryParseHttpMethod(\"GE\") == nullptr");
  }
  name_29.content.size_ = 5;
  name_29.content.ptr = "GET ";
  tryParseHttpMethod((kj *)&local_38,name_29);
  if ((local_38.content.ptr._0_1_ == (kj)0x1) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[55]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x40,ERROR,"\"failed: expected \" \"tryParseHttpMethod(\\\"GET \\\") == nullptr\"",
               (char (*) [55])"failed: expected tryParseHttpMethod(\"GET \") == nullptr");
  }
  name_30.content.size_ = 4;
  name_30.content.ptr = "get";
  tryParseHttpMethod((kj *)&local_38,name_30);
  if ((local_38.content.ptr._0_1_ == (kj)0x1) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[54]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x41,ERROR,"\"failed: expected \" \"tryParseHttpMethod(\\\"get\\\") == nullptr\"",
               (char (*) [54])"failed: expected tryParseHttpMethod(\"get\") == nullptr");
  }
  return;
}

Assistant:

TEST(Async, EvalInt) {
  EventLoop loop;
  WaitScope waitScope(loop);

  bool done = false;

  Promise<int> promise = evalLater([&]() { done = true; return 123; });
  EXPECT_FALSE(done);
  EXPECT_EQ(123, promise.wait(waitScope));
  EXPECT_TRUE(done);
}